

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_rowcol
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  parasail_result_t *ppVar7;
  int *ptr;
  int *ptr_00;
  int *ptr_01;
  ulong uVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  ulong size;
  int iVar12;
  char *__format;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int local_80;
  uint local_78;
  ulong local_70;
  int *local_68;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar10 = "_s2";
  }
  else {
    local_70 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      __format = "%s: %s must be > 0\n";
      pcVar10 = "s2Len";
    }
    else if (open < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar10 = "open";
    }
    else if (gap < 0) {
      __format = "%s: %s must be >= 0\n";
      pcVar10 = "gap";
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      __format = "%s: missing %s\n";
      pcVar10 = "matrix";
    }
    else {
      if (matrix->type != 0) {
        _s1Len = matrix->length;
LAB_004fa6f0:
        ppVar7 = parasail_result_new_rowcol1(_s1Len,s2Len);
        if (ppVar7 == (parasail_result_t *)0x0) {
          return (parasail_result_t *)0x0;
        }
        ppVar7->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 |
                       (uint)(s2_beg != 0) << 0xe | (uint)(s2_end != 0) << 0xf | ppVar7->flag |
                       0x1440102;
        ptr = parasail_memalign_int(0x10,(ulong)(uint)s2Len);
        size = (ulong)(s2Len + 1);
        ptr_00 = parasail_memalign_int(0x10,size);
        ptr_01 = parasail_memalign_int(0x10,size);
        if (ptr_01 == (int *)0x0 || (ptr_00 == (int *)0x0 || ptr == (int *)0x0)) {
          return (parasail_result_t *)0x0;
        }
        if (matrix->type == 0) {
          local_68 = parasail_memalign_int(0x10,(long)_s1Len);
          uVar8 = 0;
          if (local_68 == (int *)0x0) {
            return (parasail_result_t *)0x0;
          }
          uVar13 = 0;
          if (0 < _s1Len) {
            uVar13 = (ulong)(uint)_s1Len;
          }
          for (; uVar13 != uVar8; uVar8 = uVar8 + 1) {
            local_68[uVar8] = matrix->mapper[(byte)_s1[uVar8]];
          }
        }
        else {
          local_68 = (int *)0x0;
        }
        piVar3 = matrix->mapper;
        for (uVar8 = 0; (uint)s2Len != uVar8; uVar8 = uVar8 + 1) {
          ptr[uVar8] = piVar3[(byte)_s2[uVar8]];
        }
        *ptr_00 = 0;
        *ptr_01 = -0x40000000;
        if (s2_beg == 0) {
          iVar14 = -open;
          for (uVar8 = 1; size != uVar8; uVar8 = uVar8 + 1) {
            ptr_00[uVar8] = iVar14;
            ptr_01[uVar8] = -0x40000000;
            iVar14 = iVar14 - gap;
          }
        }
        else {
          for (uVar8 = 1; size != uVar8; uVar8 = uVar8 + 1) {
            ptr_00[uVar8] = 0;
            ptr_01[uVar8] = -0x40000000;
          }
        }
        local_80 = -0x40000000;
        local_78 = _s1Len;
        for (uVar8 = 1; iVar14 = (int)uVar8, (long)uVar8 < (long)_s1Len; uVar8 = uVar8 + 1) {
          iVar2 = matrix->size;
          lVar9 = uVar8 - 1;
          if (matrix->type == 0) {
            lVar9 = (long)local_68[uVar8 - 1];
          }
          piVar3 = matrix->matrix;
          iVar14 = (1 - iVar14) * gap - open;
          if (s1_beg != 0) {
            iVar14 = 0;
          }
          iVar5 = *ptr_00;
          *ptr_00 = iVar14;
          iVar4 = -0x40000000;
          for (lVar11 = 0; size - 1 != lVar11; lVar11 = lVar11 + 1) {
            iVar15 = ptr_00[lVar11 + 1];
            iVar12 = iVar15 - open;
            iVar16 = ptr_01[lVar11 + 1] - gap;
            if (ptr_01[lVar11 + 1] - gap < iVar12) {
              iVar16 = iVar12;
            }
            ptr_01[lVar11 + 1] = iVar16;
            iVar12 = iVar4 - gap;
            iVar4 = iVar14 - open;
            if (iVar14 - open <= iVar12) {
              iVar4 = iVar12;
            }
            iVar14 = iVar5 + piVar3[iVar2 * lVar9 + (long)ptr[lVar11]];
            if (iVar14 <= iVar4) {
              iVar14 = iVar4;
            }
            if (iVar14 <= iVar16) {
              iVar14 = iVar16;
            }
            ptr_00[lVar11 + 1] = iVar14;
            iVar5 = iVar15;
          }
          if (s1_end != 0 && local_80 < iVar14) {
            local_70 = (ulong)(s2Len - 1U);
            local_78 = (uint)(uVar8 - 1);
          }
          ((ppVar7->field_4).rowcols)->score_col[uVar8 - 1] = iVar14;
          if (s1_end != 0 && local_80 < iVar14) {
            local_80 = iVar14;
          }
        }
        piVar3 = matrix->matrix;
        iVar2 = matrix->size;
        if (matrix->type == 0) {
          iVar5 = *(int *)((long)local_68 + ((long)((uVar8 << 0x20) + -0x100000000) >> 0x1e));
        }
        else {
          iVar5 = iVar14 + -1;
        }
        iVar4 = *ptr_00;
        iVar15 = 0;
        if (s1_beg == 0) {
          iVar15 = (1 - iVar14) * gap - open;
        }
        *ptr_00 = iVar15;
        uVar1 = _s1Len - 1;
        iVar14 = -0x40000000;
        uVar13 = 1;
        do {
          if (size == uVar13) {
            if (s2_end == 0 && s1_end == 0 || local_80 < iVar15 && s1_end != 0) {
              local_80 = iVar15;
              local_78 = uVar1;
              local_70._0_4_ = s2Len - 1U;
            }
            ((ppVar7->field_4).rowcols)->score_col[(uVar8 & 0xffffffff) - 1] = iVar15;
            ppVar7->score = local_80;
            ppVar7->end_query = local_78;
            ppVar7->end_ref = (uint)local_70;
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(ptr);
            if (matrix->type == 0) {
              parasail_free(local_68);
              return ppVar7;
            }
            return ppVar7;
          }
          iVar16 = ptr_00[uVar13];
          iVar6 = iVar16 - open;
          iVar12 = ptr_01[uVar13] - gap;
          if (ptr_01[uVar13] - gap < iVar6) {
            iVar12 = iVar6;
          }
          ptr_01[uVar13] = iVar12;
          iVar6 = iVar14 - gap;
          iVar14 = iVar15 - open;
          if (iVar15 - open <= iVar6) {
            iVar14 = iVar6;
          }
          iVar15 = iVar4 + piVar3[(long)(iVar2 * iVar5) + (long)ptr[uVar13 - 1]];
          if (iVar15 <= iVar14) {
            iVar15 = iVar14;
          }
          if (iVar15 <= iVar12) {
            iVar15 = iVar12;
          }
          ptr_00[uVar13] = iVar15;
          if (s1_end == 0 || s2_end == 0) {
            if ((s2_end != 0) && (local_80 < iVar15)) goto LAB_004fabab;
          }
          else if (local_80 < iVar15) {
LAB_004fabab:
            local_70 = uVar13 - 1;
            local_78 = uVar1;
            local_80 = iVar15;
          }
          else {
            lVar9 = (long)(int)(uint)local_70;
            if ((long)uVar13 <= lVar9 && iVar15 == local_80) {
              local_70 = uVar13 - 1;
              local_78 = uVar1;
            }
          }
          ((ppVar7->field_4).rowcols)->score_row[uVar13 - 1] = iVar15;
          uVar13 = uVar13 + 1;
          iVar4 = iVar16;
        } while( true );
      }
      if (_s1 == (char *)0x0) {
        __format = "%s: missing %s\n";
        pcVar10 = "_s1";
      }
      else {
        if (0 < _s1Len) goto LAB_004fa6f0;
        __format = "%s: %s must be > 0\n";
        pcVar10 = "_s1Len";
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_rowcol",pcVar10);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    parasail_result_t *result = NULL;
    int * restrict s1 = NULL;
    int * restrict s2 = NULL;
    int * restrict H = NULL;
    int * restrict F = NULL;
    int s1Len = 0;
    int i = 0;
    int j = 0;
    int score = 0;
    int end_query = 0;
    int end_ref = 0;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    i = 0;
    j = 0;
    score = NEG_INF_32;
    end_query = s1Len;
    end_ref = s2Len;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_NOVEC
        | PARASAIL_FLAG_BITS_INT | PARASAIL_FLAG_LANES_1;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2 = parasail_memalign_int(16, s2Len);
    H = parasail_memalign_int(16, s2Len+1);
    F = parasail_memalign_int(16, s2Len+1);

    /* validate heap variables */
    if (!s2) return NULL;
    if (!H) return NULL;
    if (!F) return NULL;

    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int(16, s1Len);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
    }

    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }

    /* upper left corner */
    H[0] = 0;
    F[0] = NEG_INF_32;
    
    /* first row */
    if (s2_beg) {
        for (j=1; j<=s2Len; ++j) {
            H[j] = 0;
            F[j] = NEG_INF_32;
        }
    }
    else {
        for (j=1; j<=s2Len; ++j) {
            H[j] = -open -(j-1)*gap;
            F[j] = NEG_INF_32;
        }
    }

    /* iter over first sequence */
    for (i=1; i<s1Len; ++i) {
        const int * const restrict matrow =
            matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
            &matrix->matrix[matrix->size*s1[i-1]] :
            &matrix->matrix[matrix->size*(i-1)];
        /* init first column */
        int NH = H[0];
        int WH = s1_beg ? 0 : (-open - (i-1)*gap);
        int E = NEG_INF_32;
        H[0] = WH;
        for (j=1; j<=s2Len; ++j) {
            int H_dag;
            int E_opn;
            int E_ext;
            int F_opn;
            int F_ext;
            int NWH = NH;
            NH = H[j];
            F_opn = NH - open;
            F_ext = F[j] - gap;
            F[j] = MAX(F_opn, F_ext);
            E_opn = WH - open;
            E_ext = E - gap;
            E = MAX(E_opn, E_ext);
            H_dag = NWH + matrow[s2[j-1]];
            WH = MAX(H_dag, E);
            WH = MAX(WH, F[j]);
            H[j] = WH;
#ifdef PARASAIL_TABLE
            result->tables->score_table[1LL*(i-1)*s2Len + (j-1)] = WH;
#endif
        }
#ifdef PARASAIL_ROWCOL
        result->rowcols->score_col[i-1] = WH;
#endif
        if (s1_end && WH > score) {
            score = WH;
            end_query = i-1;
            end_ref = s2Len-1;
        }
    }
    {
        /* i == s1Len */
        const int * const restrict matrow =
            matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ?
            &matrix->matrix[matrix->size*s1[i-1]] :
            &matrix->matrix[matrix->size*(i-1)];
        /* init first column */
        int NH = H[0];
        int WH = s1_beg ? 0 : -open - (i-1)*gap;
        int E = NEG_INF_32;
        H[0] = WH;
        for (j=1; j<=s2Len; ++j) {
            int H_dag;
            int E_opn;
            int E_ext;
            int F_opn;
            int F_ext;
            int NWH = NH;
            NH = H[j];
            F_opn = NH - open;
            F_ext = F[j] - gap;
            F[j] = MAX(F_opn, F_ext);
            E_opn = WH - open;
            E_ext = E    - gap;
            E    = MAX(E_opn, E_ext);
            H_dag = NWH + matrow[s2[j-1]];
            WH = MAX(H_dag, E);
            WH = MAX(WH, F[j]);
            H[j] = WH;
            if (s1_end && s2_end) {
                if (WH > score) {
                    score = WH;
                    end_query = s1Len-1;
                    end_ref = j-1;
                }
                else if (WH == score && j-1 < end_ref) {
                    end_query = s1Len-1;
                    end_ref = j-1;
                }
            }
            else if (s2_end) {
                if (WH > score) {
                    score = WH;
                    end_query = s1Len-1;
                    end_ref = j-1;
                }
            }
#ifdef PARASAIL_TABLE
            result->tables->score_table[1LL*(i-1)*s2Len + (j-1)] = WH;
#endif
#ifdef PARASAIL_ROWCOL
            result->rowcols->score_row[j-1] = H[j];
#endif
        }
        if ((s1_end && WH > score) || (!s1_end && !s2_end)) {
            score = WH;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
#ifdef PARASAIL_ROWCOL
        result->rowcols->score_col[i-1] = WH;
#endif
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(F);
    parasail_free(H);
    parasail_free(s2);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}